

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-validator.cpp
# Opt level: O0

void wasm::FunctionValidator::visitPreCatch(FunctionValidator *self,Expression **currp)

{
  bool bVar1;
  Try *pTVar2;
  Try *curr;
  Expression **currp_local;
  FunctionValidator *self_local;
  
  pTVar2 = Expression::cast<wasm::Try>(*currp);
  bVar1 = IString::is(&(pTVar2->name).super_IString);
  if (bVar1) {
    std::
    unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
    ::erase(&self->delegateTargetNames,&pTVar2->name);
    std::
    unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
    ::insert(&self->rethrowTargetNames,&pTVar2->name);
  }
  return;
}

Assistant:

static void visitPreCatch(FunctionValidator* self, Expression** currp) {
    auto* curr = (*currp)->cast<Try>();
    if (curr->name.is()) {
      self->delegateTargetNames.erase(curr->name);
      self->rethrowTargetNames.insert(curr->name);
    }
  }